

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_range_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  find_null();
  find_boolean();
  find_integer();
  find_real();
  find_string();
  find_wstring();
  find_u16string();
  find_u32string();
  find_array_boolean();
  find_array_integer();
  find_array_real();
  find_array_string();
  find_array_wstring();
  find_array_u16string();
  find_array_u32string();
  find_array_value();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    find_null();
    find_boolean();
    find_integer();
    find_real();
    find_string();
    find_wstring();
    find_u16string();
    find_u32string();
    find_array_boolean();
    find_array_integer();
    find_array_real();
    find_array_string();
    find_array_wstring();
    find_array_u16string();
    find_array_u32string();
    find_array_value();

    return boost::report_errors();
}